

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O3

bool __thiscall dg::vr::Bucket::EdgeIterator::isViable(EdgeIterator *this)

{
  Type TVar1;
  pointer pDVar2;
  undefined1 uVar3;
  iterator iVar4;
  
  iVar4 = std::
          _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
          ::find(&((this->visited)._M_data)->_M_t,
                 &(this->stack).
                  super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].current);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(((this->visited)._M_data)->_M_t)._M_impl.super__Rb_tree_header) {
    pDVar2 = (this->stack).
             super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    TVar1 = pDVar2[-1].current._rel;
    if (((this->allowedEdges).bits.super__Base_bitset<1UL>._M_w >> ((ulong)TVar1 & 0x3f) & 1) != 0)
    {
      if (this->relationsFocused != true) {
        return true;
      }
      if ((ulong)(((long)pDVar2 -
                   (long)(this->stack).
                         super__Vector_base<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)
      {
        return true;
      }
      uVar3 = dg::vr::Relations::transitiveOver(pDVar2[-2].current._rel,TVar1);
      return (bool)uVar3;
    }
  }
  return false;
}

Assistant:

bool isViable() {
            return visited.get().find(*stack.back()) == visited.get().end() &&
                   allowedEdges.has(stack.back()->rel()) &&
                   (!relationsFocused || shouldFollowThrough());
        }